

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<float> list;
  initializer_list<float> list_00;
  ostream *poVar1;
  vector<3UL> local_100;
  string local_e8;
  vector<3UL> local_b8;
  string local_a0;
  float local_80 [4];
  iterator local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  quaternion q2;
  undefined1 local_28 [8];
  quaternion q1;
  int tick;
  
  q1.data.super_matrix<4UL,_1UL>.data[3][0] = 0.0;
  q1.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  q2.data.super_matrix<4UL,_1UL>.data[2][0] = 1.0;
  q2.data.super_matrix<4UL,_1UL>.data[3][0] = 0.0;
  list_00._M_len = 4;
  list_00._M_array = q2.data.super_matrix<4UL,_1UL>.data[2];
  blas::quaternion::quaternion((quaternion *)local_28,list_00);
  local_80[0] = 1.0;
  local_80[1] = 0.0;
  local_80[2] = 0.0;
  local_80[3] = 0.0;
  local_70 = local_80;
  local_68 = 4;
  list._M_len = 4;
  list._M_array = local_70;
  blas::quaternion::quaternion((quaternion *)local_60,list);
  while (q1.data.super_matrix<4UL,_1UL>.data[2][0] != 1.4013e-43) {
    q1.data.super_matrix<4UL,_1UL>.data[2][0] = q1.data.super_matrix<4UL,_1UL>.data[2][0] + 1;
    Mahony_update((quaternion *)local_28);
    Madgwick_update((quaternion *)local_60);
    blas::quaternion::to_euler_angles(&local_b8,(quaternion *)local_28);
    blas::vector<3ul>::to_string_abi_cxx11_(&local_a0,&local_b8);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_a0);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_a0);
    blas::quaternion::to_euler_angles(&local_100,(quaternion *)local_60);
    blas::vector<3ul>::to_string_abi_cxx11_(&local_e8,&local_100);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_e8);
    poVar1 = std::operator<<(poVar1,'\t');
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(float)q1.data.super_matrix<4UL,_1UL>.data[2][0] * 0.01);
    poVar1 = std::operator<<(poVar1,'s');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return (int)q1.data.super_matrix<4UL,_1UL>.data[3][0];
}

Assistant:

int main() {
    int tick = 0;
    blas::quaternion q1 = {1, 0, 0, 0};
    blas::quaternion q2 = {1, 0, 0, 0};
    for (;;) {
        if (tick++ == 100) break;
        Mahony_update(q1);
        Madgwick_update(q2);
        std::cout << q1.to_euler_angles().to_string() << std::endl;
        std::cout << q2.to_euler_angles().to_string() << '\t' << tick * duration << 's' << std::endl << std::endl;
    }
}